

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O1

json_value * json_parse_ex(json_settings *settings,char *json,size_t length,char *error_buf)

{
  json_type jVar1;
  _json_value *p_Var2;
  double dVar3;
  uchar uVar4;
  byte bVar5;
  uchar uVar6;
  byte bVar7;
  int iVar8;
  ushort **ppuVar9;
  json_value *pjVar10;
  undefined7 extraout_var;
  json_value *pjVar11;
  json_value *extraout_RAX;
  json_value *extraout_RAX_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  char *pcVar12;
  uint uVar13;
  json_value *pjVar14;
  json_value *pjVar15;
  json_value *pjVar16;
  ulong *puVar17;
  json_value *pjVar18;
  uint uVar19;
  uint uVar20;
  json_value *pjVar21;
  long in_FS_OFFSET;
  bool bVar22;
  json_value *root;
  char error [128];
  long local_178;
  json_value *local_170;
  json_value *local_158;
  json_value *local_150;
  json_state local_138;
  json_value *local_d0;
  json_value *local_c8;
  json_value *local_c0;
  ulong local_b8;
  undefined2 uStack_b0;
  undefined6 uStack_ae;
  undefined2 uStack_a8;
  char acStack_a6 [110];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_d0 = (json_value *)0x0;
  local_138.cur_line = 0;
  local_138.cur_col = 0;
  local_138.used_memory = 0;
  if ((((2 < length) && (*json == -0x11)) && (json[1] == -0x45)) && (json[2] == -0x41)) {
    json = json + 3;
    length = length - 3;
  }
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_138.settings.max_memory = settings->max_memory;
  local_138.settings._8_8_ = *(undefined8 *)&settings->settings;
  local_138.settings.mem_alloc = settings->mem_alloc;
  local_138.settings.mem_free = settings->mem_free;
  local_138.settings.user_data = settings->user_data;
  local_138.settings.value_extra = settings->value_extra;
  if (local_138.settings.mem_alloc == (_func_void_ptr_size_t_int_void_ptr *)0x0) {
    local_138.settings.mem_alloc = default_alloc;
  }
  pjVar18 = (json_value *)((long)&((json_value *)json)->parent + length);
  if (local_138.settings.mem_free == (_func_void_void_ptr_void_ptr *)0x0) {
    local_138.settings.mem_free = default_free;
  }
  local_138.uint_max = 0xfffffff7;
  local_138._12_4_ = 0;
  local_138.ulong_max = 0xfffffffffffffff7;
  local_138._72_8_ = 1;
  local_150 = (json_value *)0x0;
  local_158 = (json_value *)0x0;
  local_178 = 0;
LAB_00124aad:
  pjVar10 = (json_value *)0x0;
  local_c8 = (json_value *)0x0;
  local_c0 = (json_value *)0x0;
  local_138.cur_line = 1;
  pjVar16 = (json_value *)0x8;
  local_170 = (json_value *)0x0;
  uVar19 = 0;
  pjVar15 = (json_value *)json;
  do {
    pjVar14 = local_c0;
    if (pjVar15 == pjVar18) {
      pjVar11 = (json_value *)0x0;
    }
    else {
      pjVar11 = (json_value *)(ulong)*(byte *)&pjVar15->parent;
    }
    bVar5 = (byte)pjVar11;
    uVar13 = (uint)pjVar11;
    local_138.ptr = (char *)pjVar15;
    if (((ulong)pjVar16 & 0x20) == 0) {
LAB_00124b02:
      uVar20 = (uint)pjVar16;
      if ((local_138.settings._8_8_ & 1) != 0) {
        if (((ulong)pjVar16 & 0x6000) != 0) {
          if ((uVar20 >> 0xd & 1) == 0) {
            if ((uVar20 >> 0xe & 1) == 0) goto LAB_00124b0d;
            uVar20 = 7;
            if (bVar5 == 0x2a) {
              pjVar10 = pjVar15;
              if ((pjVar15 < (json_value *)((long)&pjVar18[-1]._reserved + 7U)) &&
                 (*(char *)((long)&pjVar15->parent + 1) == '/')) {
                pjVar10 = (json_value *)((long)&pjVar15->parent + 1);
                pjVar16 = (json_value *)((ulong)pjVar16 & 0xffffffffffff9fff);
                local_138.ptr = (char *)pjVar10;
              }
            }
            else {
              pjVar10 = pjVar11;
              if (uVar13 == 0) {
                pcVar12 = "%d:%d: Unexpected EOF in block comment";
                goto LAB_00124c82;
              }
            }
          }
          else {
            uVar20 = 7;
            if ((bVar5 < 0xe) && (pjVar10 = pjVar11, (0x2401U >> (uVar13 & 0x1f) & 1) != 0)) {
              pjVar16 = (json_value *)((ulong)pjVar16 & 0xffffffffffffdfff);
              local_138.ptr = (char *)((long)&pjVar15[-1]._reserved + 7);
            }
          }
          goto LAB_00125ba4;
        }
        if (bVar5 != 0x2f) goto LAB_00124b0d;
        if ((((ulong)pjVar16 & 0x88) == 0) && (local_c0->type != json_object)) {
          pcVar12 = "%d:%d: Comment not allowed here";
        }
        else {
          local_138.ptr = (char *)((long)&pjVar15->parent + 1);
          if ((json_value *)local_138.ptr != pjVar18) {
            bVar5 = *(byte *)&((json_value *)local_138.ptr)->parent;
            pjVar11 = (json_value *)(ulong)bVar5;
            if (bVar5 == 0x2a) {
              pjVar16 = (json_value *)((ulong)pjVar16 | 0x4000);
            }
            else {
              if (bVar5 != 0x2f) {
                pcVar12 = "%d:%d: Unexpected `%c` in comment opening sequence";
                goto LAB_00124c82;
              }
              pjVar16 = (json_value *)((ulong)pjVar16 | 0x2000);
            }
            goto LAB_00125b9e;
          }
          pcVar12 = "%d:%d: EOF unexpected";
        }
LAB_00124c82:
        pjVar10 = (json_value *)
                  __sprintf_chk(&local_b8,1,0x80,pcVar12,local_138._88_8_ & 0xffffffff,
                                local_138.cur_col);
LAB_00124c8c:
        uVar20 = 8;
        goto LAB_00125ba4;
      }
LAB_00124b0d:
      if ((char)pjVar16 < '\0') {
        if (uVar13 < 10) {
          uVar20 = 5;
          pjVar10 = pjVar11;
          if (uVar13 == 0) goto LAB_00125ba4;
          if (uVar13 != 9) goto LAB_00124e38;
        }
        else if ((uVar13 != 0x20) && (uVar13 != 0xd)) {
          if (uVar13 != 10) {
LAB_00124e38:
            pcVar12 = "%d:%d: Trailing garbage: `%c`";
            goto LAB_00124c82;
          }
          local_138.cur_col = 0;
          local_138.cur_line = local_138.cur_line + 1;
        }
        goto LAB_00125b9e;
      }
      if (((ulong)pjVar16 & 8) != 0) {
        uVar20 = 7;
        if (uVar13 < 0xd) {
          pjVar10 = pjVar11;
          if (uVar13 != 9) {
            if (uVar13 != 10) goto LAB_00124fe0;
LAB_00124ed9:
            uVar20 = 7;
            local_138.cur_col = 0;
            local_138.cur_line = local_138.cur_line + 1;
            pjVar10 = pjVar11;
          }
        }
        else {
          pjVar10 = pjVar11;
          if ((uVar13 != 0xd) && (uVar13 != 0x20)) {
            if (uVar13 == 0x5d) {
              if ((local_c0 == (json_value *)0x0) ||
                 (pjVar11 = local_c0, local_c0->type != json_array)) {
                pcVar12 = "%d:%d: Unexpected ]";
                goto LAB_00124c82;
              }
LAB_001253fe:
              pjVar16 = (json_value *)(((ulong)pjVar16 & 0xffffffffffffff72) + 1);
              pjVar10 = pjVar11;
              goto LAB_00125775;
            }
LAB_00124fe0:
            if (((ulong)pjVar16 & 4) == 0) {
              if (((ulong)pjVar16 & 0x40) == 0) {
                pjVar14 = (json_value *)((ulong)pjVar16 & 0xffffffffffffff33);
                if (uVar13 < 0x6e) {
                  if (uVar13 == 0x22) {
                    iVar8 = new_value(&local_138,&local_c0,&local_c8,&local_d0,json_string);
                    pjVar10 = (json_value *)CONCAT44(extraout_var_00,iVar8);
                    if (iVar8 == 0) goto LAB_00125cf7;
                    local_170 = (json_value *)(local_c0->u).object.values;
                    uVar19 = 0;
                    pjVar10 = local_170;
                    pjVar16 = (json_value *)((ulong)pjVar14 | 0x20);
                  }
                  else if (uVar13 == 0x5b) {
                    iVar8 = new_value(&local_138,&local_c0,&local_c8,&local_d0,json_array);
                    bVar22 = iVar8 == 0;
                    if (bVar22) {
                      pjVar16 = pjVar14;
                    }
LAB_00125a5f:
                    pjVar10 = (json_value *)0x20;
                    uVar20 = 7;
                    if (bVar22) {
                      uVar20 = 0x20;
                    }
                  }
                  else {
                    if (uVar13 != 0x66) goto LAB_001259ca;
                    uVar20 = 0x21;
                    pjVar10 = pjVar15;
                    pjVar16 = pjVar14;
                    if ((((3 < (long)pjVar18 - (long)pjVar15) &&
                         (local_138.ptr = (char *)((long)&pjVar15->parent + 1),
                         *(char *)((long)&pjVar15->parent + 1) == 'a')) &&
                        (local_138.ptr = (char *)((long)&pjVar15->parent + 2),
                        *(char *)((long)&pjVar15->parent + 2) == 'l')) &&
                       ((local_138.ptr = (char *)((long)&pjVar15->parent + 3),
                        *(char *)((long)&pjVar15->parent + 3) == 's' &&
                        (local_138.ptr = (char *)((long)&pjVar15->parent + 4),
                        *(char *)((long)&pjVar15->parent + 4) == 'e')))) {
                      iVar8 = new_value(&local_138,&local_c0,&local_c8,&local_d0,json_boolean);
                      pjVar10 = (json_value *)CONCAT44(extraout_var_04,iVar8);
                      if (iVar8 != 0) {
                        pjVar16 = (json_value *)((ulong)pjVar14 | 1);
                        goto LAB_00125775;
                      }
                      uVar20 = 0x20;
                    }
                  }
                  goto LAB_00125ba4;
                }
                if (uVar13 == 0x6e) {
                  if ((((long)pjVar18 - (long)pjVar15 < 3) ||
                      (local_138.ptr = (char *)((long)&pjVar15->parent + 1),
                      *(char *)((long)&pjVar15->parent + 1) != 'u')) ||
                     ((local_138.ptr = (char *)((long)&pjVar15->parent + 2),
                      *(char *)((long)&pjVar15->parent + 2) != 'l' ||
                      (local_138.ptr = (char *)((long)&pjVar15->parent + 3),
                      *(char *)((long)&pjVar15->parent + 3) != 'l')))) goto LAB_00125b18;
                  iVar8 = new_value(&local_138,&local_c0,&local_c8,&local_d0,json_null);
                  pjVar10 = (json_value *)CONCAT44(extraout_var_01,iVar8);
                  if (iVar8 != 0) {
LAB_00125b0c:
                    pjVar16 = (json_value *)((ulong)pjVar14 | 1);
                    goto LAB_00125775;
                  }
LAB_00125cf7:
                  uVar20 = 0x20;
                  pjVar16 = pjVar14;
                  goto LAB_00125ba4;
                }
                if (uVar13 == 0x74) {
                  if ((((2 < (long)pjVar18 - (long)pjVar15) &&
                       (local_138.ptr = (char *)((long)&pjVar15->parent + 1),
                       *(char *)((long)&pjVar15->parent + 1) == 'r')) &&
                      (local_138.ptr = (char *)((long)&pjVar15->parent + 2),
                      *(char *)((long)&pjVar15->parent + 2) == 'u')) &&
                     (local_138.ptr = (char *)((long)&pjVar15->parent + 3),
                     *(char *)((long)&pjVar15->parent + 3) == 'e')) {
                    iVar8 = new_value(&local_138,&local_c0,&local_c8,&local_d0,json_boolean);
                    pjVar10 = (json_value *)CONCAT44(extraout_var_02,iVar8);
                    if (iVar8 != 0) {
                      (local_c0->u).boolean = 1;
                      pjVar10 = local_c0;
                      goto LAB_00125b0c;
                    }
                    goto LAB_00125cf7;
                  }
LAB_00125b18:
                  uVar20 = 0x21;
                  pjVar10 = pjVar15;
                  pjVar16 = pjVar14;
                  goto LAB_00125ba4;
                }
                if (uVar13 == 0x7b) {
                  iVar8 = new_value(&local_138,&local_c0,&local_c8,&local_d0,json_object);
                  bVar22 = iVar8 == 0;
                  pjVar16 = pjVar14;
                  goto LAB_00125a5f;
                }
LAB_001259ca:
                ppuVar9 = __ctype_b_loc();
                if (((*(byte *)((long)*ppuVar9 + (long)(char)bVar5 * 2 + 1) & 8) == 0) &&
                   (bVar5 != 0x2d)) {
                  pjVar10 = (json_value *)
                            __sprintf_chk(&local_b8,1,0x80,"%d:%d: Unexpected %c when seeking value"
                                          ,local_138._88_8_ & 0xffffffff,local_138.cur_col,
                                          (int)(char)bVar5);
                  uVar20 = 8;
                  pjVar16 = pjVar14;
                  goto LAB_00125ba4;
                }
                iVar8 = new_value(&local_138,&local_c0,&local_c8,&local_d0,json_integer);
                pjVar10 = (json_value *)CONCAT44(extraout_var_03,iVar8);
                if (iVar8 == 0) {
                  uVar20 = 0x20;
                  pjVar16 = pjVar14;
                  goto LAB_00125ba4;
                }
                if (local_138.first_pass == 0) {
                  while (((((*ppuVar9)[(char)pjVar11] >> 0xb & 1) != 0 ||
                          ((uVar13 = (int)pjVar11 - 0x2b, pjVar10 = (json_value *)(ulong)uVar13,
                           uVar13 < 0x3b &&
                           ((0x40000000400000dU >> ((ulong)pjVar10 & 0x3f) & 1) != 0)))) &&
                         (pjVar10 = (json_value *)((long)(_json_value **)local_138.ptr + 1),
                         local_138.ptr = (char *)pjVar10, pjVar10 != pjVar18))) {
                    pjVar11 = (json_value *)(ulong)*(byte *)&pjVar10->parent;
                  }
                  pjVar16 = (json_value *)((ulong)pjVar14 | 3);
                }
                else {
                  if (bVar5 == 0x2d) {
                    local_178 = 0;
                    local_158 = (json_value *)0x0;
                    local_150 = (json_value *)0x0;
                    pjVar16 = (json_value *)((ulong)pjVar16 & 0xffffffffffffe033 | 0x100);
                    goto LAB_00125ba4;
                  }
                  pjVar16 = (json_value *)((ulong)pjVar16 & 0xffffffffffffe033 | 2);
                  local_178 = 0;
                  local_158 = (json_value *)0x0;
                  local_150 = (json_value *)0x0;
                }
                goto LAB_00125775;
              }
              if (bVar5 != 0x3a) {
                pcVar12 = "%d:%d: Expected : before %c";
                goto LAB_00125746;
              }
              pjVar10 = pjVar11;
              pjVar16 = (json_value *)((ulong)pjVar16 & 0xffffffffffffff3b);
            }
            else {
              if (bVar5 != 0x2c) {
                pcVar12 = "%d:%d: Expected , before %c";
LAB_00125746:
                pjVar10 = (json_value *)
                          __sprintf_chk(&local_b8,1,0x80,pcVar12,local_138.cur_line,
                                        local_138.cur_col,(int)(char)bVar5);
                goto LAB_00124c8c;
              }
              pjVar10 = pjVar11;
              pjVar16 = (json_value *)((ulong)pjVar16 & 0xffffffffffffff7b);
            }
          }
        }
        goto LAB_00125ba4;
      }
      jVar1 = local_c0->type;
      if (1 < jVar1 - json_integer) {
        pjVar10 = (json_value *)(ulong)(jVar1 - json_integer);
        if (jVar1 != json_object) goto LAB_00125775;
        uVar20 = 7;
        if (0x1f < uVar13) {
          if (uVar13 < 0x2c) {
            pjVar10 = pjVar11;
            if (uVar13 == 0x20) goto LAB_00125ba4;
            if (uVar13 == 0x22) {
              if (((ulong)pjVar16 & 4) != 0) {
                pcVar12 = "%d:%d: Expected , before \"";
                goto LAB_00124c82;
              }
              pjVar16 = (json_value *)((ulong)pjVar16 | 0x20);
              local_170 = (local_c0->_reserved).next_alloc;
              uVar19 = 0;
              pjVar10 = local_170;
              goto LAB_00125775;
            }
          }
          else if (uVar13 == 0x2c) {
            if (((ulong)pjVar16 & 4) != 0) {
              pjVar16 = (json_value *)((ulong)pjVar16 & 0xffffffffffffff73);
              pjVar10 = pjVar11;
              goto LAB_00125775;
            }
          }
          else if (uVar13 == 0x7d) goto LAB_001253fe;
LAB_00125661:
          pcVar12 = "%d:%d: Unexpected `%c` in object";
          goto LAB_00124c82;
        }
        pjVar10 = pjVar11;
        if (uVar13 != 9) {
          if (uVar13 == 10) goto LAB_00124ed9;
          if (uVar13 != 0xd) goto LAB_00125661;
        }
        goto LAB_00125ba4;
      }
      ppuVar9 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar9 + (long)(char)bVar5 * 2 + 1) & 8) != 0) {
        iVar8 = (int)(char)bVar5;
        if ((jVar1 == json_integer) || (((ulong)pjVar16 & 0x400) != 0)) {
          if ((uVar20 >> 10 & 1) == 0) {
            if ((uVar20 >> 9 & 1) != 0) {
              pjVar10 = (json_value *)
                        __sprintf_chk(&local_b8,1,0x80,"%d:%d: Unexpected `0` before `%c`",
                                      local_138._88_8_ & 0xffffffff,local_138.cur_col,iVar8);
              uVar20 = 8;
              local_178 = local_178 + 1;
              goto LAB_00125ba4;
            }
            pjVar10 = (json_value *)((ulong)pjVar16 | 0x200);
            if (bVar5 != 0x30) {
              pjVar10 = pjVar16;
            }
            if (local_178 == 0) {
              pjVar16 = pjVar10;
            }
            pjVar10 = (json_value *)(((long)iVar8 + (pjVar14->u).integer * 10) - 0x30);
            (pjVar14->u).integer = (int64_t)pjVar10;
          }
          else {
            pjVar16 = (json_value *)((ulong)pjVar16 | 0x800);
            pjVar10 = (json_value *)(((long)iVar8 + (long)local_158 * 10) - 0x30);
            local_158 = pjVar10;
          }
        }
        else {
          pjVar10 = (json_value *)(((long)iVar8 + (long)local_150 * 10) - 0x30);
          local_150 = pjVar10;
        }
        uVar20 = 7;
        local_178 = local_178 + 1;
        goto LAB_00125ba4;
      }
      if (bVar5 == 0x2b) {
LAB_00124b73:
        pjVar11 = (json_value *)(ulong)(uVar20 & 0xc00);
        if ((uVar20 & 0xc00) == 0x400) {
          pjVar10 = (json_value *)((ulong)(bVar5 == 0x2d) << 0xc | (ulong)pjVar16 | 0x800);
          uVar20 = 7;
          pjVar16 = pjVar10;
          goto LAB_00125ba4;
        }
LAB_0012545d:
        if ((uVar20 >> 10 & 1) == 0) {
          if (jVar1 == json_double) {
            if (local_178 == 0) {
              pcVar12 = "%d:%d: Expected digit after `.`";
              goto LAB_00125893;
            }
            dVar3 = pow(10.0,(double)local_178);
            (pjVar14->u).dbl = (double)(long)local_150 / dVar3 + (pjVar14->u).dbl;
            pjVar11 = extraout_RAX;
          }
          if ((bVar5 & 0xdf) == 0x45) {
            if (pjVar14->type == json_integer) {
              pjVar14->type = json_double;
              (pjVar14->u).dbl = (double)(pjVar14->u).integer;
            }
            pjVar16 = (json_value *)((ulong)pjVar16 & 0xfffffffffffff977 | 0x400);
LAB_001258c3:
            uVar20 = 7;
            goto LAB_001258c9;
          }
        }
        else {
          if (local_178 == 0) {
            pcVar12 = "%d:%d: Expected digit after `e`";
LAB_00125893:
            pjVar10 = (json_value *)
                      __sprintf_chk(&local_b8,1,0x80,pcVar12,local_138.cur_line,local_138.cur_col);
            uVar20 = 8;
            local_178 = 0;
            goto LAB_00125ba4;
          }
          pjVar10 = (json_value *)-(long)local_158;
          if ((uVar20 >> 0xc & 1) == 0) {
            pjVar10 = local_158;
          }
          dVar3 = pow(10.0,(double)(long)pjVar10);
          (pjVar14->u).dbl = dVar3 * (pjVar14->u).dbl;
          pjVar11 = extraout_RAX_00;
        }
        if ((uVar20 >> 8 & 1) != 0) {
          if (pjVar14->type == json_integer) {
            (pjVar14->u).integer = -(pjVar14->u).integer;
          }
          else {
            (pjVar14->u).integer = (pjVar14->u).integer ^ 0x8000000000000000;
          }
        }
        pjVar16 = (json_value *)((ulong)pjVar16 | 3);
        pjVar10 = pjVar11;
LAB_00125775:
        if (((ulong)pjVar16 & 2) != 0) {
          pjVar16 = (json_value *)((ulong)pjVar16 & 0xfffffffffffffffd);
          local_138.ptr =
               (char *)((long)&((json_value *)((long)local_138.ptr + -0x28))->_reserved + 7);
        }
        uVar20 = 0;
        if (((ulong)pjVar16 & 1) != 0) {
          p_Var2 = local_c0->parent;
          if (p_Var2 == (_json_value *)0x0) {
            pjVar16 = (json_value *)((ulong)pjVar16 & 0xfffffffffffffffa | 0x84);
            pjVar11 = local_c0;
            goto LAB_00125b9e;
          }
          jVar1 = p_Var2->type;
          if (local_138.first_pass == 0) {
            if (jVar1 == json_array) {
              puVar17 = (ulong *)((p_Var2->u).string.ptr + (ulong)(p_Var2->u).string.length * 8);
            }
            else {
              if (jVar1 != json_object) goto LAB_001257f6;
              puVar17 = (ulong *)((p_Var2->u).string.ptr +
                                 (ulong)(p_Var2->u).string.length * 0x18 + 0x10);
            }
            *puVar17 = (ulong)local_c0;
          }
LAB_001257f6:
          pjVar16 = (json_value *)
                    ((ulong)pjVar16 & 0xfffffffffffffffa | (ulong)(jVar1 == json_array) << 3 | 4);
          uVar13 = (local_c0->parent->u).boolean + 1;
          (local_c0->parent->u).string.length = uVar13;
          uVar20 = 9;
          pjVar10 = local_c0;
          if (uVar13 <= local_138.uint_max) {
            local_c0 = local_c0->parent;
            pjVar11 = local_c0;
            goto LAB_00125b9e;
          }
        }
      }
      else {
        if (uVar13 != 0x2e) {
          if (uVar13 == 0x2d) goto LAB_00124b73;
          goto LAB_0012545d;
        }
        if (jVar1 != json_integer) goto LAB_0012545d;
        if (local_178 != 0) {
          pjVar14->type = json_double;
          (pjVar14->u).dbl = (double)(pjVar14->u).integer;
          goto LAB_001258c3;
        }
        pjVar11 = (json_value *)
                  __sprintf_chk(&local_b8,1,0x80,"%d:%d: Expected digit before `.`",
                                local_138._88_8_ & 0xffffffff,local_138.cur_col);
        uVar20 = 8;
LAB_001258c9:
        local_178 = 0;
        pjVar10 = pjVar11;
      }
    }
    else {
      if (bVar5 == 0) {
        pcVar12 = "Unexpected EOF in string (at %d:%d)";
        goto LAB_00124c82;
      }
      uVar20 = 9;
      if (local_138.uint_max < uVar19) goto LAB_00125ba4;
      pjVar21 = pjVar11;
      if (((ulong)pjVar16 & 0x10) == 0) {
        if (bVar5 == 0x22) {
          if (local_138.first_pass == 0) {
            *(undefined1 *)((long)&local_170->parent + (ulong)uVar19) = 0;
          }
          pjVar16 = (json_value *)((ulong)pjVar16 & 0xffffffffffffffcf);
          if (local_c0->type != json_object) {
            if (local_c0->type == json_string) {
              (local_c0->u).string.length = uVar19;
              pjVar16 = (json_value *)((ulong)pjVar16 | 1);
            }
            local_170 = (json_value *)0x0;
            pjVar10 = local_c0;
            goto LAB_00124b02;
          }
          if (local_138.first_pass == 0) {
            *(anon_union_8_2_291a86ad_for__reserved *)
             ((local_c0->u).string.ptr + (ulong)(local_c0->u).string.length * 0x18) =
                 local_c0->_reserved;
            pjVar10 = (json_value *)&local_c0->_reserved;
            (local_c0->u).object.values[(local_c0->u).string.length].name_length = uVar19;
          }
          else {
            pjVar10 = (json_value *)((long)&local_c0->u + 8);
          }
          ((anon_union_8_2_291a86ad_for__reserved *)&pjVar10->parent)->next_alloc =
               (_json_value *)
               ((long)&((anon_union_8_2_291a86ad_for__reserved *)&pjVar10->parent)->next_alloc->
                       parent + (ulong)(uVar19 + 1));
          uVar20 = 7;
          local_170 = (json_value *)0x0;
          pjVar16 = (json_value *)((ulong)pjVar16 | 0x48);
          goto LAB_00125ba4;
        }
        if (uVar13 == 0x5c) {
          pjVar16 = (json_value *)((ulong)pjVar16 | 0x10);
          goto LAB_00125b9e;
        }
switchD_00124dff_caseD_6f:
        if (local_138.first_pass == 0) {
          *(char *)((long)&((json_value *)(ulong)uVar19)->parent + (long)&local_170->parent) =
               (char)pjVar21;
          pjVar11 = (json_value *)(ulong)uVar19;
        }
        goto LAB_00125b9b;
      }
      pjVar16 = (json_value *)((ulong)pjVar16 & 0xffffffffffffffef);
      if (7 < uVar13 - 0x6e) {
        if (uVar13 == 0x66) {
          if (local_138.first_pass == 0) {
            *(undefined1 *)((long)&((json_value *)(ulong)uVar19)->parent + (long)&local_170->parent)
                 = 0xc;
            pjVar11 = (json_value *)(ulong)uVar19;
          }
        }
        else {
          if (uVar13 != 0x62) goto switchD_00124dff_caseD_6f;
          if (local_138.first_pass == 0) {
            *(undefined1 *)((long)&((json_value *)(ulong)uVar19)->parent + (long)&local_170->parent)
                 = 8;
            pjVar11 = (json_value *)(ulong)uVar19;
          }
        }
        goto LAB_00125b9b;
      }
      pjVar11 = (json_value *)
                ((long)&switchD_00124dff::switchdataD_0014b610 +
                (long)(int)(&switchD_00124dff::switchdataD_0014b610)[uVar13 - 0x6e]);
      switch(uVar13) {
      case 0x6e:
        if (local_138.first_pass == 0) {
          pjVar11 = (json_value *)(ulong)uVar19;
          *(undefined1 *)((long)&pjVar11->parent + (long)&local_170->parent) = 10;
        }
        break;
      default:
        goto switchD_00124dff_caseD_6f;
      case 0x72:
        if (local_138.first_pass == 0) {
          *(undefined1 *)((long)&((json_value *)(ulong)uVar19)->parent + (long)&local_170->parent) =
               0xd;
          pjVar11 = (json_value *)(ulong)uVar19;
        }
        break;
      case 0x74:
        if (local_138.first_pass == 0) {
          *(undefined1 *)((long)&((json_value *)(ulong)uVar19)->parent + (long)&local_170->parent) =
               9;
          pjVar11 = (json_value *)(ulong)uVar19;
        }
        break;
      case 0x75:
        if ((long)pjVar18 - (long)pjVar15 < 5) {
LAB_001252c1:
          pjVar10 = (json_value *)
                    __sprintf_chk(&local_b8,1,0x80,"Invalid character value `%c` (at %d:%d)",0x75,
                                  local_138._88_8_ & 0xffffffff,local_138.cur_col);
          uVar20 = 8;
          goto LAB_00125ba4;
        }
        local_138.ptr = (char *)((long)&pjVar15->parent + 1);
        uVar4 = hex_value(*(char *)((long)&pjVar15->parent + 1));
        if (uVar4 == 0xff) goto LAB_001252c1;
        local_138.ptr = (char *)((long)&pjVar15->parent + 2);
        bVar5 = hex_value(*(char *)((long)&pjVar15->parent + 2));
        if (bVar5 == 0xff) goto LAB_001252c1;
        local_138.ptr = (char *)((long)&pjVar15->parent + 3);
        uVar6 = hex_value(*(char *)((long)&pjVar15->parent + 3));
        if (uVar6 == 0xff) goto LAB_001252c1;
        pjVar10 = (json_value *)((long)&pjVar15->parent + 4);
        local_138.ptr = (char *)pjVar10;
        bVar7 = hex_value(*(char *)((long)&pjVar15->parent + 4));
        if (bVar7 == 0xff) goto LAB_001252c1;
        bVar7 = bVar7 | uVar6 << 4;
        pjVar11 = (json_value *)CONCAT71(extraout_var,bVar7);
        uVar13 = (uint)CONCAT11(bVar5 | uVar4 << 4,bVar7);
        pjVar21 = (json_value *)(ulong)uVar13;
        if ((byte)(bVar5 & 0xf8 | uVar4 << 4) == 0xd8) {
          if ((((long)pjVar18 - (long)pjVar10 < 7) ||
              (local_138.ptr = (char *)((long)&pjVar15->parent + 5),
              *(char *)((long)&pjVar15->parent + 5) != '\\')) ||
             (local_138.ptr = (char *)((long)&pjVar15->parent + 6),
             *(char *)((long)&pjVar15->parent + 6) != 'u')) {
LAB_00125b2a:
            bVar22 = false;
            pjVar11 = (json_value *)
                      __sprintf_chk(&local_b8,1,0x80,"Invalid character value `%c` (at %d:%d)",0x75,
                                    local_138._88_8_ & 0xffffffff,local_138.cur_col);
            uVar20 = 8;
          }
          else {
            local_138.ptr = (char *)((long)&pjVar15->parent + 7);
            uVar4 = hex_value(*(char *)((long)&pjVar15->parent + 7));
            if (uVar4 == 0xff) goto LAB_00125b2a;
            local_138.ptr = (char *)&pjVar15->type;
            bVar5 = hex_value((char)pjVar15->type);
            if (bVar5 == 0xff) goto LAB_00125b2a;
            local_138.ptr = (char *)((long)&pjVar15->type + 1);
            uVar4 = hex_value(*(byte *)((long)&pjVar15->type + 1));
            if (uVar4 == 0xff) goto LAB_00125b2a;
            local_138.ptr = (char *)((long)&pjVar15->type + 2);
            bVar7 = hex_value(*(byte *)((long)&pjVar15->type + 2));
            if (bVar7 == 0xff) goto LAB_00125b2a;
            bVar7 = bVar7 | uVar4 << 4;
            pjVar11 = (json_value *)(ulong)bVar7;
            pjVar21 = (json_value *)
                      (ulong)((uint)bVar7 + ((bVar5 & 3) << 8 | (uVar13 & 0x3bf) << 10) + 0x10000);
            uVar20 = 0;
            bVar22 = true;
          }
          pjVar10 = pjVar11;
          if (!bVar22) goto LAB_00125ba4;
        }
        uVar13 = (uint)pjVar21;
        if (uVar13 < 0x80) goto switchD_00124dff_caseD_6f;
        if (uVar13 < 0x800) {
          if (local_138.first_pass == 0) {
            pjVar11 = (json_value *)((ulong)pjVar21 >> 6 | 0xc0);
            uVar13 = uVar19 + 1;
            *(char *)((long)&local_170->parent + (ulong)uVar19) = (char)pjVar11;
            uVar19 = uVar19 + 2;
LAB_00125e7b:
            *(byte *)((long)&local_170->parent + (ulong)uVar13) = (byte)pjVar21 & 0x3f | 0x80;
          }
          else {
            uVar19 = uVar19 + 2;
          }
        }
        else {
          pjVar11 = (json_value *)(local_138._72_8_ & 0xffffffff);
          if (uVar13 < 0x10000) {
            if (local_138.first_pass == 0) {
              *(byte *)((long)&local_170->parent + (ulong)uVar19) =
                   (byte)((ulong)pjVar21 >> 0xc) | 0xe0;
              pjVar11 = (json_value *)((ulong)pjVar21 >> 6 & 0x3ffff3f | 0x80);
              uVar13 = uVar19 + 2;
              *(char *)((long)&local_170->parent + (ulong)(uVar19 + 1)) = (char)pjVar11;
              uVar19 = uVar19 + 3;
              *(byte *)((long)&local_170->parent + (ulong)uVar13) = (byte)pjVar21 & 0x3f | 0x80;
            }
            else {
              uVar19 = uVar19 + 3;
            }
          }
          else {
            if (local_138.first_pass == 0) {
              *(byte *)((long)&local_170->parent + (ulong)uVar19) =
                   (byte)((ulong)pjVar21 >> 0x12) | 0xf0;
              *(byte *)((long)&local_170->parent + (ulong)(uVar19 + 1)) =
                   (byte)((ulong)pjVar21 >> 0xc) & 0x3f | 0x80;
              pjVar11 = (json_value *)((ulong)pjVar21 >> 6 & 0x3ffff3f | 0x80);
              uVar13 = uVar19 + 3;
              *(char *)((long)&local_170->parent + (ulong)(uVar19 + 2)) = (char)pjVar11;
              uVar19 = uVar19 + 4;
              goto LAB_00125e7b;
            }
            uVar19 = uVar19 + 4;
          }
        }
        goto LAB_00125b9e;
      }
LAB_00125b9b:
      uVar19 = uVar19 + 1;
LAB_00125b9e:
      uVar20 = 7;
      pjVar10 = pjVar11;
    }
LAB_00125ba4:
    if ((uVar20 != 0) && (uVar20 != 7)) break;
    pjVar15 = (json_value *)((long)(_json_value **)local_138.ptr + 1);
  } while( true );
  if (uVar20 == 5) {
    local_d0 = local_c8;
    uVar20 = 0;
    pjVar10 = local_c8;
  }
  if (uVar20 == 0) {
    iVar8 = local_138.first_pass;
    local_138.first_pass = local_138.first_pass + -1;
    pjVar10 = local_c8;
    if (iVar8 < 1) goto LAB_0012602a;
    goto LAB_00124aad;
  }
  if (uVar20 < 0x20) {
    if (uVar20 == 8) goto LAB_00125f74;
    if (uVar20 != 9) goto LAB_0012602a;
    pcVar12 = "%d:%d: Too long (caught overflow)";
  }
  else {
    if (uVar20 == 0x20) {
      uStack_a8 = 0x206e;
      builtin_strncpy(acStack_a6,"failure",8);
      local_b8._0_1_ = 'M';
      local_b8._1_1_ = 'e';
      local_b8._2_1_ = 'm';
      local_b8._3_1_ = 'o';
      local_b8._4_1_ = 'r';
      local_b8._5_1_ = 'y';
      local_b8._6_1_ = ' ';
      local_b8._7_1_ = 'a';
      uStack_b0 = 0x6c6c;
      uStack_ae = 0x6f697461636f;
      goto LAB_00125f74;
    }
    if (uVar20 != 0x21) goto LAB_0012602a;
    pcVar12 = "%d:%d: Unknown value";
  }
  __sprintf_chk(&local_b8,1,0x80,pcVar12,local_138.cur_line,local_138.cur_col);
LAB_00125f74:
  if (error_buf != (char *)0x0) {
    if ((char)local_b8 == '\0') {
      builtin_strncpy(error_buf,"Unknown error",0xe);
    }
    else {
      strcpy(error_buf,(char *)&local_b8);
    }
  }
  if (local_138.first_pass != 0) {
    local_d0 = local_c8;
  }
  pjVar18 = local_d0;
  if (local_d0 != (json_value *)0x0) {
    do {
      p_Var2 = (pjVar18->_reserved).next_alloc;
      (*local_138.settings.mem_free)(pjVar18,local_138.settings.user_data);
      pjVar18 = p_Var2;
    } while (p_Var2 != (_json_value *)0x0);
    local_c0 = (json_value *)0x0;
  }
  local_d0 = (json_value *)0x0;
  if (local_138.first_pass == 0) {
    json_value_free_ex(&local_138.settings,local_c8);
  }
  pjVar10 = (json_value *)0x0;
LAB_0012602a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pjVar10;
}

Assistant:

json_value * json_parse_ex (json_settings * settings,
                            const json_char * json,
                            size_t length,
                            char * error_buf)
{
   json_char error [json_error_max];
   const json_char * end;
   json_value * top, * root, * alloc = 0;
   json_state state = { 0 };
   long flags;
   long num_digits = 0, num_e = 0;
   json_int_t num_fraction = 0;

   /* Skip UTF-8 BOM
    */
   if (length >= 3 && ((unsigned char) json [0]) == 0xEF
                   && ((unsigned char) json [1]) == 0xBB
                   && ((unsigned char) json [2]) == 0xBF)
   {
      json += 3;
      length -= 3;
   }

   error[0] = '\0';
   end = (json + length);

   memcpy (&state.settings, settings, sizeof (json_settings));

   if (!state.settings.mem_alloc)
      state.settings.mem_alloc = default_alloc;

   if (!state.settings.mem_free)
      state.settings.mem_free = default_free;

   memset (&state.uint_max, 0xFF, sizeof (state.uint_max));
   memset (&state.ulong_max, 0xFF, sizeof (state.ulong_max));

   state.uint_max -= 8; /* limit of how much can be added before next check */
   state.ulong_max -= 8;

   for (state.first_pass = 1; state.first_pass >= 0; -- state.first_pass)
   {
      json_uchar uchar;
      unsigned char uc_b1, uc_b2, uc_b3, uc_b4;
      json_char * string = 0;
      unsigned int string_length = 0;

      top = root = 0;
      flags = flag_seek_value;

      state.cur_line = 1;

      for (state.ptr = json ;; ++ state.ptr)
      {
         json_char b = (state.ptr == end ? 0 : *state.ptr);
         
         if (flags & flag_string)
         {
            if (!b)
            {  sprintf (error, "Unexpected EOF in string (at %d:%d)", line_and_col);
               goto e_failed;
            }

            if (string_length > state.uint_max)
               goto e_overflow;

            if (flags & flag_escaped)
            {
               flags &= ~ flag_escaped;

               switch (b)
               {
                  case 'b':  string_add ('\b');  break;
                  case 'f':  string_add ('\f');  break;
                  case 'n':  string_add ('\n');  break;
                  case 'r':  string_add ('\r');  break;
                  case 't':  string_add ('\t');  break;
                  case 'u':

                    if (end - state.ptr <= 4 || 
                        (uc_b1 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b2 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b3 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b4 = hex_value (*++ state.ptr)) == 0xFF)
                    {
                        sprintf (error, "Invalid character value `%c` (at %d:%d)", b, line_and_col);
                        goto e_failed;
                    }

                    uc_b1 = (uc_b1 << 4) | uc_b2;
                    uc_b2 = (uc_b3 << 4) | uc_b4;
                    uchar = (uc_b1 << 8) | uc_b2;

                    if ((uchar & 0xF800) == 0xD800) {
                        json_uchar uchar2;
                        
                        if (end - state.ptr <= 6 || (*++ state.ptr) != '\\' || (*++ state.ptr) != 'u' ||
                            (uc_b1 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b2 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b3 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b4 = hex_value (*++ state.ptr)) == 0xFF)
                        {
                            sprintf (error, "Invalid character value `%c` (at %d:%d)", b, line_and_col);
                            goto e_failed;
                        }

                        uc_b1 = (uc_b1 << 4) | uc_b2;
                        uc_b2 = (uc_b3 << 4) | uc_b4;
                        uchar2 = (uc_b1 << 8) | uc_b2;
                        
                        uchar = 0x010000 | ((uchar & 0x3FF) << 10) | (uchar2 & 0x3FF);
                    }

                    if (sizeof (json_char) >= sizeof (json_uchar) || (uchar <= 0x7F))
                    {
                       string_add ((json_char) uchar);
                       break;
                    }

                    if (uchar <= 0x7FF)
                    {
                        if (state.first_pass)
                           string_length += 2;
                        else
                        {  string [string_length ++] = 0xC0 | (uchar >> 6);
                           string [string_length ++] = 0x80 | (uchar & 0x3F);
                        }

                        break;
                    }

                    if (uchar <= 0xFFFF) {
                        if (state.first_pass)
                           string_length += 3;
                        else
                        {  string [string_length ++] = 0xE0 | (uchar >> 12);
                           string [string_length ++] = 0x80 | ((uchar >> 6) & 0x3F);
                           string [string_length ++] = 0x80 | (uchar & 0x3F);
                        }
                        
                        break;
                    }

                    if (state.first_pass)
                       string_length += 4;
                    else
                    {  string [string_length ++] = 0xF0 | (uchar >> 18);
                       string [string_length ++] = 0x80 | ((uchar >> 12) & 0x3F);
                       string [string_length ++] = 0x80 | ((uchar >> 6) & 0x3F);
                       string [string_length ++] = 0x80 | (uchar & 0x3F);
                    }

                    break;

                  default:
                     string_add (b);
               };

               continue;
            }

            if (b == '\\')
            {
               flags |= flag_escaped;
               continue;
            }

            if (b == '"')
            {
               if (!state.first_pass)
                  string [string_length] = 0;

               flags &= ~ flag_string;
               string = 0;

               switch (top->type)
               {
                  case json_string:

                     top->u.string.length = string_length;
                     flags |= flag_next;

                     break;

                  case json_object:

                     if (state.first_pass)
                        (*(json_char **) &top->u.object.values) += string_length + 1;
                     else
                     {  
                        top->u.object.values [top->u.object.length].name
                           = (json_char *) top->_reserved.object_mem;

                        top->u.object.values [top->u.object.length].name_length
                           = string_length;

                        (*(json_char **) &top->_reserved.object_mem) += string_length + 1;
                     }

                     flags |= flag_seek_value | flag_need_colon;
                     continue;

                  default:
                     break;
               };
            }
            else
            {
               string_add (b);
               continue;
            }
         }

         if (state.settings.settings & json_enable_comments)
         {
            if (flags & (flag_line_comment | flag_block_comment))
            {
               if (flags & flag_line_comment)
               {
                  if (b == '\r' || b == '\n' || !b)
                  {
                     flags &= ~ flag_line_comment;
                     -- state.ptr;  /* so null can be reproc'd */
                  }

                  continue;
               }

               if (flags & flag_block_comment)
               {
                  if (!b)
                  {  sprintf (error, "%d:%d: Unexpected EOF in block comment", line_and_col);
                     goto e_failed;
                  }

                  if (b == '*' && state.ptr < (end - 1) && state.ptr [1] == '/')
                  {
                     flags &= ~ flag_block_comment;
                     ++ state.ptr;  /* skip closing sequence */
                  }

                  continue;
               }
            }
            else if (b == '/')
            {
               if (! (flags & (flag_seek_value | flag_done)) && top->type != json_object)
               {  sprintf (error, "%d:%d: Comment not allowed here", line_and_col);
                  goto e_failed;
               }

               if (++ state.ptr == end)
               {  sprintf (error, "%d:%d: EOF unexpected", line_and_col);
                  goto e_failed;
               }

               switch (b = *state.ptr)
               {
                  case '/':
                     flags |= flag_line_comment;
                     continue;

                  case '*':
                     flags |= flag_block_comment;
                     continue;

                  default:
                     sprintf (error, "%d:%d: Unexpected `%c` in comment opening sequence", line_and_col, b);
                     goto e_failed;
               };
            }
         }

         if (flags & flag_done)
         {
            if (!b)
               break;

            switch (b)
            {
               whitespace:
                  continue;

               default:

                  sprintf (error, "%d:%d: Trailing garbage: `%c`",
                           state.cur_line, state.cur_col, b);

                  goto e_failed;
            };
         }

         if (flags & flag_seek_value)
         {
            switch (b)
            {
               whitespace:
                  continue;

               case ']':

                  if (top && top->type == json_array)
                     flags = (flags & ~ (flag_need_comma | flag_seek_value)) | flag_next;
                  else
                  {  sprintf (error, "%d:%d: Unexpected ]", line_and_col);
                     goto e_failed;
                  }

                  break;

               default:

                  if (flags & flag_need_comma)
                  {
                     if (b == ',')
                     {  flags &= ~ flag_need_comma;
                        continue;
                     }
                     else
                     {
                        sprintf (error, "%d:%d: Expected , before %c",
                                 state.cur_line, state.cur_col, b);

                        goto e_failed;
                     }
                  }

                  if (flags & flag_need_colon)
                  {
                     if (b == ':')
                     {  flags &= ~ flag_need_colon;
                        continue;
                     }
                     else
                     { 
                        sprintf (error, "%d:%d: Expected : before %c",
                                 state.cur_line, state.cur_col, b);

                        goto e_failed;
                     }
                  }

                  flags &= ~ flag_seek_value;

                  switch (b)
                  {
                     case '{':

                        if (!new_value (&state, &top, &root, &alloc, json_object))
                           goto e_alloc_failure;

                        continue;

                     case '[':

                        if (!new_value (&state, &top, &root, &alloc, json_array))
                           goto e_alloc_failure;

                        flags |= flag_seek_value;
                        continue;

                     case '"':

                        if (!new_value (&state, &top, &root, &alloc, json_string))
                           goto e_alloc_failure;

                        flags |= flag_string;

                        string = top->u.string.ptr;
                        string_length = 0;

                        continue;

                     case 't':

                        if ((end - state.ptr) < 3 || *(++ state.ptr) != 'r' ||
                            *(++ state.ptr) != 'u' || *(++ state.ptr) != 'e')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_boolean))
                           goto e_alloc_failure;

                        top->u.boolean = 1;

                        flags |= flag_next;
                        break;

                     case 'f':

                        if ((end - state.ptr) < 4 || *(++ state.ptr) != 'a' ||
                            *(++ state.ptr) != 'l' || *(++ state.ptr) != 's' ||
                            *(++ state.ptr) != 'e')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_boolean))
                           goto e_alloc_failure;

                        flags |= flag_next;
                        break;

                     case 'n':

                        if ((end - state.ptr) < 3 || *(++ state.ptr) != 'u' ||
                            *(++ state.ptr) != 'l' || *(++ state.ptr) != 'l')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_null))
                           goto e_alloc_failure;

                        flags |= flag_next;
                        break;

                     default:

                        if (isdigit (b) || b == '-')
                        {
                           if (!new_value (&state, &top, &root, &alloc, json_integer))
                              goto e_alloc_failure;

                           if (!state.first_pass)
                           {
                              while (isdigit (b) || b == '+' || b == '-'
                                        || b == 'e' || b == 'E' || b == '.')
                              {
                                 if ( (++ state.ptr) == end)
                                 {
                                    b = 0;
                                    break;
                                 }

                                 b = *state.ptr;
                              }

                              flags |= flag_next | flag_reproc;
                              break;
                           }

                           flags &= ~ (flag_num_negative | flag_num_e |
                                        flag_num_e_got_sign | flag_num_e_negative |
                                           flag_num_zero);

                           num_digits = 0;
                           num_fraction = 0;
                           num_e = 0;

                           if (b != '-')
                           {
                              flags |= flag_reproc;
                              break;
                           }

                           flags |= flag_num_negative;
                           continue;
                        }
                        else
                        {  sprintf (error, "%d:%d: Unexpected %c when seeking value", line_and_col, b);
                           goto e_failed;
                        }
                  };
            };
         }
         else
         {
            switch (top->type)
            {
            case json_object:
               
               switch (b)
               {
                  whitespace:
                     continue;

                  case '"':

                     if (flags & flag_need_comma)
                     {  sprintf (error, "%d:%d: Expected , before \"", line_and_col);
                        goto e_failed;
                     }

                     flags |= flag_string;

                     string = (json_char *) top->_reserved.object_mem;
                     string_length = 0;

                     break;
                  
                  case '}':

                     flags = (flags & ~ flag_need_comma) | flag_next;
                     break;

                  case ',':

                     if (flags & flag_need_comma)
                     {
                        flags &= ~ flag_need_comma;
                        break;
                     }

                  default:
                     sprintf (error, "%d:%d: Unexpected `%c` in object", line_and_col, b);
                     goto e_failed;
               };

               break;

            case json_integer:
            case json_double:

               if (isdigit (b))
               {
                  ++ num_digits;

                  if (top->type == json_integer || flags & flag_num_e)
                  {
                     if (! (flags & flag_num_e))
                     {
                        if (flags & flag_num_zero)
                        {  sprintf (error, "%d:%d: Unexpected `0` before `%c`", line_and_col, b);
                           goto e_failed;
                        }

                        if (num_digits == 1 && b == '0')
                           flags |= flag_num_zero;
                     }
                     else
                     {
                        flags |= flag_num_e_got_sign;
                        num_e = (num_e * 10) + (b - '0');
                        continue;
                     }

                     top->u.integer = (top->u.integer * 10) + (b - '0');
                     continue;
                  }

                  num_fraction = (num_fraction * 10) + (b - '0');
                  continue;
               }

               if (b == '+' || b == '-')
               {
                  if ( (flags & flag_num_e) && !(flags & flag_num_e_got_sign))
                  {
                     flags |= flag_num_e_got_sign;

                     if (b == '-')
                        flags |= flag_num_e_negative;

                     continue;
                  }
               }
               else if (b == '.' && top->type == json_integer)
               {
                  if (!num_digits)
                  {  sprintf (error, "%d:%d: Expected digit before `.`", line_and_col);
                     goto e_failed;
                  }

                  top->type = json_double;
                  top->u.dbl = (double) top->u.integer;

                  num_digits = 0;
                  continue;
               }

               if (! (flags & flag_num_e))
               {
                  if (top->type == json_double)
                  {
                     if (!num_digits)
                     {  sprintf (error, "%d:%d: Expected digit after `.`", line_and_col);
                        goto e_failed;
                     }

                     top->u.dbl += ((double) num_fraction) / (pow (10.0, (double) num_digits));
                  }

                  if (b == 'e' || b == 'E')
                  {
                     flags |= flag_num_e;

                     if (top->type == json_integer)
                     {
                        top->type = json_double;
                        top->u.dbl = (double) top->u.integer;
                     }

                     num_digits = 0;
                     flags &= ~ flag_num_zero;

                     continue;
                  }
               }
               else
               {
                  if (!num_digits)
                  {  sprintf (error, "%d:%d: Expected digit after `e`", line_and_col);
                     goto e_failed;
                  }

                  top->u.dbl *= pow (10.0, (double)
                      (flags & flag_num_e_negative ? - num_e : num_e));
               }

               if (flags & flag_num_negative)
               {
                  if (top->type == json_integer)
                     top->u.integer = - top->u.integer;
                  else
                     top->u.dbl = - top->u.dbl;
               }

               flags |= flag_next | flag_reproc;
               break;

            default:
               break;
            };
         }

         if (flags & flag_reproc)
         {
            flags &= ~ flag_reproc;
            -- state.ptr;
         }

         if (flags & flag_next)
         {
            flags = (flags & ~ flag_next) | flag_need_comma;

            if (!top->parent)
            {
               /* root value done */

               flags |= flag_done;
               continue;
            }

            if (top->parent->type == json_array)
               flags |= flag_seek_value;
               
            if (!state.first_pass)
            {
               json_value * parent = top->parent;

               switch (parent->type)
               {
                  case json_object:

                     parent->u.object.values
                        [parent->u.object.length].value = top;

                     break;

                  case json_array:

                     parent->u.array.values
                           [parent->u.array.length] = top;

                     break;

                  default:
                     break;
               };
            }

            if ( (++ top->parent->u.array.length) > state.uint_max)
               goto e_overflow;

            top = top->parent;

            continue;
         }
      }

      alloc = root;
   }

   return root;

e_unknown_value:

   sprintf (error, "%d:%d: Unknown value", line_and_col);
   goto e_failed;

e_alloc_failure:

   strcpy (error, "Memory allocation failure");
   goto e_failed;

e_overflow:

   sprintf (error, "%d:%d: Too long (caught overflow)", line_and_col);
   goto e_failed;

e_failed:

   if (error_buf)
   {
      if (*error)
         strcpy (error_buf, error);
      else
         strcpy (error_buf, "Unknown error");
   }

   if (state.first_pass)
      alloc = root;

   while (alloc)
   {
      top = alloc->_reserved.next_alloc;
      state.settings.mem_free (alloc, state.settings.user_data);
      alloc = top;
   }

   if (!state.first_pass)
      json_value_free_ex (&state.settings, root);

   return 0;
}